

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_statemachine(Curl_easy *data,connectdata *conn)

{
  anon_union_280_10_9f9d5394_for_proto *pp;
  ushort *puVar1;
  dynbuf *s;
  uchar *puVar2;
  ulong uVar3;
  IMAP *pIVar4;
  byte bVar5;
  _Bool _Var6;
  unsigned_short uVar7;
  CURLcode CVar8;
  int iVar9;
  char *src;
  void *pvVar10;
  int *__s1;
  char *pcVar11;
  size_t sVar12;
  connectdata *pcVar13;
  byte *pbVar14;
  size_t __n;
  long lVar15;
  saslprogress local_50;
  undefined4 uStack_4c;
  int pop3code;
  size_t local_40;
  size_t nread;
  
  nread = 0;
  if ((conn->proto).pop3c.state == POP3_UPGRADETLS) {
    CVar8 = pop3_perform_upgrade_tls(data,conn);
    return CVar8;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar8 = Curl_pp_flushsend(data,&(pp->ftpc).pp);
    return CVar8;
  }
  do {
    CVar8 = Curl_pp_readresp(data,0,&(pp->ftpc).pp,&pop3code,&nread);
    iVar9 = pop3code;
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if (pop3code == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).pop3c.state) {
    case POP3_SERVERGREET:
      pcVar13 = data->conn;
      pcVar11 = Curl_dyn_ptr(&(pcVar13->proto).ftpc.pp.recvbuf);
      if (iVar9 != 0x2b) {
        Curl_failf(data,"Got unexpected pop3-server response");
        return CURLE_WEIRD_SERVER_REPLY;
      }
      uVar3 = (data->conn->proto).ftpc.pp.nfinal;
      if (3 < uVar3) {
        src = (char *)memchr(pcVar11,0x3c,uVar3);
        if ((src != (char *)0x0) &&
           (pvVar10 = memchr(src,0x3e,(size_t)(pcVar11 + (uVar3 - (long)src))),
           pvVar10 != (void *)0x0)) {
          __n = (long)pvVar10 + (1 - (long)src);
          pvVar10 = memchr(src,0x40,__n);
          if (pvVar10 != (void *)0x0) {
            pvVar10 = Curl_memdup0(src,__n);
            (pcVar13->proto).imapc.dyn.toobig = (size_t)pvVar10;
            if (pvVar10 == (void *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            puVar2 = &(pcVar13->proto).pop3c.authtypes;
            *puVar2 = *puVar2 | 2;
          }
        }
        CVar8 = pop3_perform_capa(data,pcVar13);
        break;
      }
      goto LAB_001462a1;
    case POP3_CAPA:
      pcVar13 = data->conn;
      __s1 = (int *)Curl_dyn_ptr(&(pcVar13->proto).ftpc.pp.recvbuf);
      if (iVar9 != 0x2b) {
        if (iVar9 == 0x2a) {
          uVar3 = (data->conn->proto).ftpc.pp.nfinal;
          if (3 < uVar3) {
            if (*__s1 == 0x534c5453) {
              pbVar14 = (byte *)((long)&pcVar13->proto + 0xe2);
              *pbVar14 = *pbVar14 | 2;
            }
            else if (*__s1 == 0x52455355) {
              puVar2 = &(pcVar13->proto).pop3c.authtypes;
              *puVar2 = *puVar2 | 1;
            }
            else if ((uVar3 != 4) && (iVar9 = bcmp(__s1,"SASL ",5), iVar9 == 0)) {
              puVar2 = &(pcVar13->proto).pop3c.authtypes;
              *puVar2 = *puVar2 | 4;
              pbVar14 = (byte *)((long)__s1 + 5);
              lVar15 = uVar3 - 5;
              do {
                lVar15 = -lVar15;
                while( true ) {
                  if (lVar15 == 0) goto LAB_001462a1;
                  if ((0x20 < (ulong)*pbVar14) ||
                     ((0x100002600U >> ((ulong)*pbVar14 & 0x3f) & 1) == 0)) break;
                  pbVar14 = pbVar14 + 1;
                  lVar15 = lVar15 + 1;
                }
                sVar12 = 0;
                while ((local_40 = -lVar15, lVar15 + sVar12 != 0 &&
                       ((0x20 < (ulong)pbVar14[sVar12] ||
                        (local_40 = sVar12,
                        (0x100002600U >> ((ulong)pbVar14[sVar12] & 0x3f) & 1) == 0))))) {
                  sVar12 = sVar12 + 1;
                }
                uVar7 = Curl_sasl_decode_mech((char *)pbVar14,local_40,(size_t *)&local_50);
                if ((uVar7 != 0) && (CONCAT44(uStack_4c,local_50) == local_40)) {
                  puVar1 = (ushort *)((long)&pcVar13->proto + 0xd0);
                  *puVar1 = *puVar1 | uVar7;
                }
                pbVar14 = pbVar14 + local_40;
                lVar15 = -(lVar15 + local_40);
              } while( true );
            }
          }
          goto LAB_001462a1;
        }
        puVar2 = &(pcVar13->proto).pop3c.authtypes;
        *puVar2 = *puVar2 | 1;
      }
      if (((data->set).use_ssl != '\0') && (_Var6 = Curl_conn_is_ssl(pcVar13,0), !_Var6)) {
        if ((iVar9 == 0x2b) && ((*(byte *)((long)&pcVar13->proto + 0xe2) & 2) != 0)) {
          CVar8 = Curl_pp_sendf(data,&(pcVar13->proto).ftpc.pp,"%s","STLS");
          if (CVar8 != CURLE_OK) {
            return CVar8;
          }
          (data->conn->proto).pop3c.state = POP3_STARTTLS;
          goto LAB_001462a1;
        }
        if (1 < (data->set).use_ssl) {
          pcVar11 = "STLS not supported.";
LAB_001463df:
          Curl_failf(data,pcVar11);
          return CURLE_USE_SSL_FAILED;
        }
      }
LAB_00146207:
      CVar8 = pop3_perform_authentication(data,pcVar13);
      break;
    case POP3_STARTTLS:
      if ((data->conn->proto).ftpc.pp.overflow != 0) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if (pop3code != 0x2b) {
        pcVar13 = conn;
        if ((data->set).use_ssl != '\x01') {
          pcVar11 = "STARTTLS denied";
          goto LAB_001463df;
        }
        goto LAB_00146207;
      }
      CVar8 = pop3_perform_upgrade_tls(data,conn);
      break;
    default:
      goto switchD_00145eac_caseD_4;
    case POP3_AUTH:
      pcVar13 = data->conn;
      CVar8 = Curl_sasl_continue((SASL *)&(pcVar13->proto).imapc.sasl.authmechs,data,pop3code,
                                 &local_50);
      if (CVar8 == CURLE_OK) {
        if (local_50 == SASL_IDLE) {
          bVar5 = (pcVar13->proto).pop3c.preftype & (pcVar13->proto).pop3c.authtypes;
          if ((bVar5 & 2) == 0) {
            if ((bVar5 & 1) == 0) {
              Curl_failf(data,"Authentication cancelled");
              CVar8 = CURLE_LOGIN_DENIED;
            }
            else {
              CVar8 = pop3_perform_user(data,pcVar13);
            }
          }
          else {
            CVar8 = pop3_perform_apop(data,pcVar13);
          }
        }
        else {
          CVar8 = CURLE_OK;
          if (local_50 == SASL_DONE) {
            (data->conn->proto).pop3c.state = POP3_STOP;
          }
        }
      }
      break;
    case POP3_APOP:
      if (pop3code != 0x2b) {
        pcVar11 = "Authentication failed: %d";
        goto LAB_001463b0;
      }
      goto switchD_00145eac_caseD_4;
    case POP3_USER:
      if (pop3code != 0x2b) {
LAB_0014638b:
        pcVar11 = "Access denied. %c";
LAB_001463b0:
        Curl_failf(data,pcVar11,(ulong)(uint)pop3code);
        return CURLE_LOGIN_DENIED;
      }
      pcVar11 = data->conn->passwd;
      if (pcVar11 == (char *)0x0) {
        pcVar11 = "";
      }
      CVar8 = Curl_pp_sendf(data,&(data->conn->proto).ftpc.pp,"PASS %s",pcVar11);
      if (CVar8 != CURLE_OK) {
        return CVar8;
      }
      (data->conn->proto).pop3c.state = POP3_PASS;
      goto LAB_001462a1;
    case POP3_PASS:
      if (pop3code != 0x2b) goto LAB_0014638b;
switchD_00145eac_caseD_4:
      (data->conn->proto).pop3c.state = POP3_STOP;
      goto LAB_001462a1;
    case POP3_COMMAND:
      pcVar13 = data->conn;
      if (pop3code == 0x2b) {
        pIVar4 = (data->req).p.imap;
        (pcVar13->proto).pop3c.eob = 2;
        (pcVar13->proto).pop3c.strip = 2;
        if (pIVar4->transfer == PPTRANSFER_BODY) {
          Curl_xfer_setup1(data,1,-1,false);
          sVar12 = (pcVar13->proto).ftpc.pp.overflow;
          if (sVar12 != 0) {
            s = &(pcVar13->proto).ftpc.pp.recvbuf;
            Curl_dyn_tail(s,sVar12);
            (pcVar13->proto).ftpc.pp.nfinal = 0;
            if (((data->req).field_0xdb & 2) == 0) {
              pcVar11 = Curl_dyn_ptr(s);
              sVar12 = Curl_dyn_len(s);
              CVar8 = pop3_write(data,pcVar11,sVar12,false);
              if (CVar8 != CURLE_OK) {
                return CVar8;
              }
            }
            Curl_dyn_reset(s);
            goto LAB_00146287;
          }
        }
        else {
LAB_00146287:
          (pcVar13->proto).ftpc.pp.overflow = 0;
        }
        pcVar13 = data->conn;
        CVar8 = CURLE_OK;
      }
      else {
        CVar8 = CURLE_WEIRD_SERVER_REPLY;
      }
      (pcVar13->proto).pop3c.state = POP3_STOP;
    }
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
LAB_001462a1:
    if ((conn->proto).pop3c.state == POP3_STOP) {
      return CURLE_OK;
    }
    _Var6 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var6) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode pop3_statemachine(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  int pop3code;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;
  size_t nread = 0;
  (void)data;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not POP3 */
  if(pop3c->state == POP3_UPGRADETLS)
    return pop3_perform_upgrade_tls(data, conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

 do {
    /* Read the response from the server */
   result = Curl_pp_readresp(data, FIRSTSOCKET, pp, &pop3code, &nread);
   if(result)
     return result;

    if(!pop3code)
      break;

    /* We have now received a full POP3 server response */
    switch(pop3c->state) {
    case POP3_SERVERGREET:
      result = pop3_state_servergreet_resp(data, pop3code, pop3c->state);
      break;

    case POP3_CAPA:
      result = pop3_state_capa_resp(data, pop3code, pop3c->state);
      break;

    case POP3_STARTTLS:
      result = pop3_state_starttls_resp(data, conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH:
      result = pop3_state_auth_resp(data, pop3code, pop3c->state);
      break;

#ifndef CURL_DISABLE_DIGEST_AUTH
    case POP3_APOP:
      result = pop3_state_apop_resp(data, pop3code, pop3c->state);
      break;
#endif

    case POP3_USER:
      result = pop3_state_user_resp(data, pop3code, pop3c->state);
      break;

    case POP3_PASS:
      result = pop3_state_pass_resp(data, pop3code, pop3c->state);
      break;

    case POP3_COMMAND:
      result = pop3_state_command_resp(data, pop3code, pop3c->state);
      break;

    case POP3_QUIT:
      pop3_state(data, POP3_STOP);
      break;

    default:
      /* internal error */
      pop3_state(data, POP3_STOP);
      break;
    }
  } while(!result && pop3c->state != POP3_STOP && Curl_pp_moredata(pp));

  return result;
}